

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaJsonWriter::BeginValue(VmaJsonWriter *this,bool isString)

{
  size_t sVar1;
  StackItem *pSVar2;
  
  sVar1 = (this->m_Stack).m_Count;
  if (sVar1 != 0) {
    pSVar2 = (this->m_Stack).m_pArray;
    if ((pSVar2[sVar1 - 1].type == COLLECTION_TYPE_OBJECT) &&
       ((pSVar2[sVar1 - 1].valueCount & 1) != 0)) {
      VmaStringBuilder::Add(this->m_SB,": ");
    }
    else {
      if (pSVar2[sVar1 - 1].valueCount != 0) {
        VmaStringBuilder::Add(this->m_SB,", ");
      }
      WriteIndent(this,false);
    }
    pSVar2[sVar1 - 1].valueCount = pSVar2[sVar1 - 1].valueCount + 1;
  }
  return;
}

Assistant:

bool empty() const { return m_Count == 0; }